

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

FileMetaData *
leveldb::FindSmallestBoundaryFile
          (InternalKeyComparator *icmp,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *level_files,
          InternalKey *largest_key)

{
  InternalKey *this;
  Comparator *pCVar1;
  FileMetaData *pFVar2;
  size_type sVar3;
  FileMetaData *pFVar4;
  int iVar5;
  pointer ppFVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  FileMetaData *local_80;
  Slice local_58;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ppFVar6 = (level_files->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((level_files->
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>)._M_impl
      .super__Vector_impl_data._M_finish == ppFVar6) {
    local_80 = (FileMetaData *)0x0;
  }
  else {
    pCVar1 = icmp->user_comparator_;
    local_80 = (FileMetaData *)0x0;
    uVar7 = 0;
    do {
      pFVar2 = ppFVar6[uVar7];
      sVar3 = (pFVar2->smallest).rep_._M_string_length;
      if (sVar3 == 0) {
LAB_0066e726:
        __assert_fail("!rep_.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/dbformat.h"
                      ,0x96,"Slice leveldb::InternalKey::Encode() const");
      }
      this = &pFVar2->smallest;
      local_48.size_ = sVar3;
      local_48.data_ = (this->rep_)._M_dataplus._M_p;
      sVar3 = (largest_key->rep_)._M_string_length;
      if (sVar3 == 0) goto LAB_0066e726;
      local_58.size_ = sVar3;
      local_58.data_ = (largest_key->rep_)._M_dataplus._M_p;
      iVar5 = (*(icmp->super_Comparator)._vptr_Comparator[2])(icmp,&local_48,&local_58);
      pFVar4 = local_80;
      if (0 < iVar5) {
        local_48 = InternalKey::user_key(this);
        local_58 = InternalKey::user_key(largest_key);
        iVar5 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_48,&local_58);
        if ((iVar5 == 0) && (pFVar4 = pFVar2, local_80 != (FileMetaData *)0x0)) {
          sVar3 = (pFVar2->smallest).rep_._M_string_length;
          if (sVar3 == 0) goto LAB_0066e726;
          local_48.size_ = sVar3;
          local_48.data_ = (this->rep_)._M_dataplus._M_p;
          sVar3 = (local_80->smallest).rep_._M_string_length;
          if (sVar3 == 0) goto LAB_0066e726;
          local_58.size_ = sVar3;
          local_58.data_ = (local_80->smallest).rep_._M_dataplus._M_p;
          iVar5 = (*(icmp->super_Comparator)._vptr_Comparator[2])(icmp,&local_48,&local_58);
          pFVar4 = local_80;
          if (iVar5 < 0) {
            pFVar4 = pFVar2;
          }
        }
      }
      local_80 = pFVar4;
      uVar7 = uVar7 + 1;
      ppFVar6 = (level_files->
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(level_files->
                                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar6 >> 3)
            );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_80;
}

Assistant:

FileMetaData* FindSmallestBoundaryFile(
    const InternalKeyComparator& icmp,
    const std::vector<FileMetaData*>& level_files,
    const InternalKey& largest_key) {
  const Comparator* user_cmp = icmp.user_comparator();
  FileMetaData* smallest_boundary_file = nullptr;
  for (size_t i = 0; i < level_files.size(); ++i) {
    FileMetaData* f = level_files[i];
    if (icmp.Compare(f->smallest, largest_key) > 0 &&
        user_cmp->Compare(f->smallest.user_key(), largest_key.user_key()) ==
            0) {
      if (smallest_boundary_file == nullptr ||
          icmp.Compare(f->smallest, smallest_boundary_file->smallest) < 0) {
        smallest_boundary_file = f;
      }
    }
  }
  return smallest_boundary_file;
}